

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O1

vector<duckdb::SimilarCatalogEntry,_true> *
duckdb::Catalog::SimilarEntriesInSchemas
          (vector<duckdb::SimilarCatalogEntry,_true> *__return_storage_ptr__,ClientContext *context,
          EntryLookupInfo *lookup_info,reference_set_t<SchemaCatalogEntry> *schemas)

{
  SchemaCatalogEntry *pSVar1;
  reference pvVar2;
  _Hash_node_base *p_Var3;
  SimilarCatalogEntry entry;
  CatalogTransaction transaction;
  value_type local_88;
  CatalogTransaction local_58;
  
  (__return_storage_ptr__->
  super_vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>).
  super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>).
  super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>).
  super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var3 = (schemas->_M_h)._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      pSVar1 = (SchemaCatalogEntry *)p_Var3[1]._M_nxt;
      CatalogTransaction::CatalogTransaction
                (&local_58,(pSVar1->super_InCatalogEntry).catalog,context);
      (*(pSVar1->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x1e])
                (&local_88,pSVar1,lookup_info);
      if (local_88.name._M_string_length != 0) {
        if ((__return_storage_ptr__->
            super_vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>)
            .
            super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (__return_storage_ptr__->
            super_vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>)
            .
            super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pvVar2 = vector<duckdb::SimilarCatalogEntry,_true>::operator[](__return_storage_ptr__,0);
          if (local_88.score < pvVar2->score) goto LAB_00264a16;
        }
        if ((__return_storage_ptr__->
            super_vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>)
            .
            super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (__return_storage_ptr__->
            super_vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>)
            .
            super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pvVar2 = vector<duckdb::SimilarCatalogEntry,_true>::operator[](__return_storage_ptr__,0);
          if (pvVar2->score <= local_88.score && local_88.score != pvVar2->score) {
            ::std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
            ::clear(&__return_storage_ptr__->
                     super_vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
                   );
          }
        }
        ::std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>::
        push_back(&__return_storage_ptr__->
                   super_vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
                  ,&local_88);
        pvVar2 = vector<duckdb::SimilarCatalogEntry,_true>::back(__return_storage_ptr__);
        (pvVar2->schema).ptr = pSVar1;
      }
LAB_00264a16:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.name._M_dataplus._M_p != &local_88.name.field_2) {
        operator_delete(local_88.name._M_dataplus._M_p);
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<SimilarCatalogEntry> Catalog::SimilarEntriesInSchemas(ClientContext &context, const EntryLookupInfo &lookup_info,
                                                             const reference_set_t<SchemaCatalogEntry> &schemas) {
	vector<SimilarCatalogEntry> results;
	for (auto schema_ref : schemas) {
		auto &schema = schema_ref.get();
		auto transaction = schema.catalog.GetCatalogTransaction(context);
		auto entry = schema.GetSimilarEntry(transaction, lookup_info);
		if (!entry.Found()) {
			// no similar entry found
			continue;
		}
		if (results.empty() || results[0].score <= entry.score) {
			if (!results.empty() && results[0].score < entry.score) {
				results.clear();
			}

			results.push_back(entry);
			results.back().schema = &schema;
		}
	}
	return results;
}